

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joiner_session.cpp
# Opt level: O3

void __thiscall
ot::commissioner::JoinerSession::RelaySocket::RelaySocket(RelaySocket *this,RelaySocket *aOther)

{
  undefined8 uVar1;
  pointer puVar2;
  MessageSubType MVar3;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__Socket_00274e80;
  memcpy(&(this->super_Socket).mEventBase,&(aOther->super_Socket).mEventBase,0x88);
  *(undefined8 *)&(this->super_Socket).mEventHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 8) = 0
  ;
  (this->super_Socket).mEventHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Socket).mEventHandler._M_invoker = (aOther->super_Socket).mEventHandler._M_invoker;
  if ((aOther->super_Socket).mEventHandler.super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar1 = *(undefined8 *)
             ((long)&(aOther->super_Socket).mEventHandler.super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->super_Socket).mEventHandler.super__Function_base._M_functor =
         *(undefined8 *)&(aOther->super_Socket).mEventHandler.super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 8) =
         uVar1;
    (this->super_Socket).mEventHandler.super__Function_base._M_manager =
         (aOther->super_Socket).mEventHandler.super__Function_base._M_manager;
    (aOther->super_Socket).mEventHandler.super__Function_base._M_manager = (_Manager_type)0x0;
    (aOther->super_Socket).mEventHandler._M_invoker = (_Invoker_type)0x0;
  }
  MVar3 = (aOther->super_Socket).mSubType;
  (this->super_Socket).mIsConnected = (aOther->super_Socket).mIsConnected;
  (this->super_Socket).mSubType = MVar3;
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__RelaySocket_00274cf0;
  this->mJoinerSession = aOther->mJoinerSession;
  puVar2 = (aOther->mPeerAddr).mBytes.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start =
       (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_start;
  (this->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = puVar2;
  (this->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage =
       (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage;
  (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (aOther->mPeerAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mPeerPort = aOther->mPeerPort;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&(this->mLocalAddr).mBytes,&(aOther->mLocalAddr).mBytes);
  this->mLocalPort = aOther->mLocalPort;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

JoinerSession::RelaySocket::RelaySocket(RelaySocket &&aOther)
    : Socket(std::move(static_cast<Socket &&>(aOther)))
    , mJoinerSession(aOther.mJoinerSession)
    , mPeerAddr(std::move(aOther.mPeerAddr))
    , mPeerPort(std::move(aOther.mPeerPort))
    , mLocalAddr(aOther.mLocalAddr)
    , mLocalPort(aOther.mLocalPort)
{
}